

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigTest.cpp
# Opt level: O3

void __thiscall
jaegertracing::Config_testParse_Test::~Config_testParse_Test(Config_testParse_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(Config, testParse)
{
    {
        constexpr auto kConfigYAML = R"cfg(
disabled: true
traceid_128bit: true
sampler:
    type: probabilistic
    param: 0.001
reporter:
    queueSize: 100
    bufferFlushInterval: 10
    logSpans: false
    localAgentHostPort: 127.0.0.1:6831
headers:
    jaegerDebugHeader: debug-id
    jaegerBaggageHeader: baggage
    TraceContextHeaderName: trace-id
    traceBaggageHeaderPrefix: "testctx-"
baggage_restrictions:
    denyBaggageOnInitializationFailure: false
    hostPort: 127.0.0.1:5778
    refreshInterval: 60
)cfg";
        const auto config = Config::parse(YAML::Load(kConfigYAML));
        ASSERT_EQ("probabilistic", config.sampler().type());
        ASSERT_EQ("debug-id", config.headers().jaegerDebugHeader());
        ASSERT_EQ("baggage", config.headers().jaegerBaggageHeader());
        ASSERT_EQ("trace-id", config.headers().traceContextHeaderName());
        ASSERT_EQ("testctx-", config.headers().traceBaggageHeaderPrefix());
    }

    {
        Config::parse(YAML::Load(R"cfg(
disabled: false
traceid_128bit: false
sampler: 1
reporter: 2
headers: 3
baggage_restrictions: 4
)cfg"));
    }
}